

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

int __thiscall rcg::System::getMinorVersion(System *this)

{
  element_type *peVar1;
  long in_RDI;
  size_t size;
  INFO_DATATYPE type;
  uint32_t ret;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_t local_20;
  INFO_DATATYPE local_18;
  int local_14 [5];
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  local_14[0] = 0;
  local_20 = 4;
  if (*(long *)(in_RDI + 0x70) == 0) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10e24e);
    (*peVar1->GCGetInfo)(10,&local_18,local_14,&local_20);
  }
  else {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10e1fc);
    (*peVar1->TLGetInfo)(*(TL_HANDLE *)(in_RDI + 0x70),10,&local_18,local_14,&local_20);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x10e27d);
  return local_14[0];
}

Assistant:

int System::getMinorVersion()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  uint32_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (tl != 0)
  {
    gentl->TLGetInfo(tl, GenTL::TL_INFO_GENTL_VER_MINOR, &type, &ret, &size);
  }
  else
  {
    gentl->GCGetInfo(GenTL::TL_INFO_GENTL_VER_MINOR, &type, &ret, &size);
  }

  return static_cast<int>(ret);
}